

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conmon.c
# Opt level: O0

int lws_conmon_append_copy_new_dns_results(lws *wsi,addrinfo *cai)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  addrinfo *__dest;
  lws_log_cx *cx;
  long local_48;
  size_t cl;
  size_t al;
  addrinfo *paStack_28;
  char skip;
  addrinfo *ai;
  addrinfo *cai_local;
  lws *wsi_local;
  
  ai = cai;
  if ((wsi->flags & 0x10000000U) != 0) {
    for (; ai != (addrinfo *)0x0; ai = ai->ai_next) {
      bVar2 = false;
      for (paStack_28 = (wsi->conmon).dns_results_copy; paStack_28 != (addrinfo *)0x0;
          paStack_28 = paStack_28->ai_next) {
        if ((((paStack_28->ai_family != ai->ai_family) && (paStack_28->ai_addrlen != ai->ai_addrlen)
             ) && (paStack_28->ai_protocol != ai->ai_protocol)) &&
           (((paStack_28->ai_socktype != ai->ai_socktype && (paStack_28->ai_family == 2)) &&
            (*(int *)(paStack_28->ai_addr->sa_data + 2) == *(int *)(ai->ai_addr->sa_data + 2))))) {
          bVar2 = true;
          break;
        }
      }
      if (!bVar2) {
        uVar1 = ai->ai_addrlen;
        if (ai->ai_canonname == (char *)0x0) {
          local_48 = 0;
        }
        else {
          sVar3 = strlen(ai->ai_canonname);
          local_48 = sVar3 + 1;
        }
        __dest = (addrinfo *)
                 lws_realloc((void *)0x0,(ulong)uVar1 + 0x30 + local_48,
                             "lws_conmon_append_copy_new_dns_results");
        if (__dest == (addrinfo *)0x0) {
          cx = lwsl_wsi_get_cx(wsi);
          _lws_log_cx(cx,lws_log_prepend_wsi,wsi,2,"lws_conmon_append_copy_new_dns_results","OOM");
          return 1;
        }
        memcpy(__dest,ai,0x30);
        __dest->ai_addr = (sockaddr *)(__dest + 1);
        memcpy(__dest->ai_addr,ai->ai_addr,(ulong)ai->ai_addrlen);
        if (local_48 != 0) {
          __dest->ai_canonname = __dest->ai_addr->sa_data + ((ulong)ai->ai_addrlen - 2);
          memcpy(__dest->ai_canonname,ai->ai_canonname,local_48 + 1);
        }
        __dest->ai_next = (wsi->conmon).dns_results_copy;
        (wsi->conmon).dns_results_copy = __dest;
      }
    }
  }
  return 0;
}

Assistant:

int
lws_conmon_append_copy_new_dns_results(struct lws *wsi,
				       const struct addrinfo *cai)
{
	if (!(wsi->flags & LCCSCF_CONMON))
		return 0;

	/*
	 * Let's go through the incoming guys, seeing if we already have them,
	 * or if we want to take a copy
	 */

	while (cai) {
		struct addrinfo *ai = wsi->conmon.dns_results_copy;
		char skip = 0;

		/* do we already have this guy? */

		while (ai) {

			if (ai->ai_family != cai->ai_family &&
			    ai->ai_addrlen != cai->ai_addrlen &&
			    ai->ai_protocol != cai->ai_protocol &&
			    ai->ai_socktype != cai->ai_socktype &&
			    /* either ipv4 or v6 address must match */
			    ((ai->ai_family == AF_INET &&
			      ((struct sockaddr_in *)ai->ai_addr)->
							     sin_addr.s_addr ==
			      ((struct sockaddr_in *)cai->ai_addr)->
							     sin_addr.s_addr)
#if defined(LWS_WITH_IPV6)
					    ||
			    (ai->ai_family == AF_INET6 &&
			     !memcmp(((struct sockaddr_in6 *)ai->ai_addr)->
							     sin6_addr.s6_addr,
				     ((struct sockaddr_in6 *)cai->ai_addr)->
						     sin6_addr.s6_addr, 16))
#endif
			    )) {
				/* yes, we already got a copy then */
				skip = 1;
				break;
			}

			ai = ai->ai_next;
		}

		if (!skip) {
			/*
			 * No we don't already have a copy of this one, let's
			 * allocate and append it then
			 */
			size_t al = sizeof(struct addrinfo) +
				    (size_t)cai->ai_addrlen;
			size_t cl = cai->ai_canonname ?
					strlen(cai->ai_canonname) + 1 : 0;

			ai = lws_malloc(al + cl, __func__);
			if (!ai) {
				lwsl_wsi_warn(wsi, "OOM");
				return 1;
			}
			*ai = *cai;
			ai->ai_addr = (struct sockaddr *)&ai[1];
			memcpy(ai->ai_addr, cai->ai_addr, (size_t)cai->ai_addrlen);

			if (cl) {
				ai->ai_canonname = ((char *)ai->ai_addr) +
							cai->ai_addrlen;
				memcpy(ai->ai_canonname, cai->ai_canonname,
				       cl + 1);
			}
			ai->ai_next = wsi->conmon.dns_results_copy;
			wsi->conmon.dns_results_copy = ai;
		}

		cai = cai->ai_next;
	}

	return 0;
}